

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

CallInfo * luaE_extendCI(lua_State *L)

{
  CallInfo *pCVar1;
  CallInfo *pCVar2;
  
  pCVar2 = (CallInfo *)luaM_malloc_(L,0x40,0);
  pCVar1 = L->ci;
  pCVar1->next = pCVar2;
  pCVar2->previous = pCVar1;
  pCVar2->next = (CallInfo *)0x0;
  (pCVar2->u).l.trap = 0;
  L->nci = L->nci + 1;
  return pCVar2;
}

Assistant:

CallInfo *luaE_extendCI (lua_State *L) {
  CallInfo *ci;
  lua_assert(L->ci->next == NULL);
  ci = luaM_new(L, CallInfo);
  lua_assert(L->ci->next == NULL);
  L->ci->next = ci;
  ci->previous = L->ci;
  ci->next = NULL;
  ci->u.l.trap = 0;
  L->nci++;
  return ci;
}